

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-mpi.c
# Opt level: O1

int big_block_mpi_grow_simple(BigBlock *bb,int Nfile_grow,size_t size_grow,MPI_Comm comm)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  size_t *fsize_grow;
  size_t asStack_40 [2];
  undefined1 local_2c [8];
  int rank;
  
  uVar4 = (ulong)(uint)Nfile_grow;
  lVar1 = -(uVar4 * 8 + 0xf & 0xfffffffffffffff0);
  fsize_grow = (size_t *)((long)asStack_40 + lVar1 + 8);
  if (0 < Nfile_grow) {
    uVar5 = 0;
    uVar3 = 0;
    do {
      fsize_grow[uVar5] = (size_grow + uVar3) / uVar4 - uVar3 / uVar4;
      uVar5 = uVar5 + 1;
      uVar3 = size_grow + uVar3;
    } while (uVar4 != uVar5);
  }
  *(undefined8 *)((long)asStack_40 + lVar1) = 0x1046bf;
  MPI_Comm_rank(comm,local_2c);
  *(undefined8 *)((long)asStack_40 + lVar1) = 0x1046d0;
  iVar2 = big_block_mpi_grow(bb,Nfile_grow,fsize_grow,comm);
  return iVar2;
}

Assistant:

int
big_block_mpi_grow_simple(BigBlock * bb, int Nfile_grow, size_t size_grow, MPI_Comm comm)
{
    size_t fsize[Nfile_grow];
    int i;
    for(i = 0; i < Nfile_grow; i ++) {
        fsize[i] = size_grow * (i + 1) / Nfile_grow
                 - size_grow * (i) / Nfile_grow;
    }
    int rank;
    MPI_Comm_rank(comm, &rank);

    return big_block_mpi_grow(bb, Nfile_grow, fsize, comm);
}